

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

wchar_t effect_calculate_value(effect_handler_context_t_conflict *context,_Bool use_boost)

{
  int iVar1;
  wchar_t local_20;
  wchar_t final;
  _Bool use_boost_local;
  effect_handler_context_t_conflict *context_local;
  
  local_20 = L'\0';
  if (set_value == L'\0') {
    if ((L'\0' < (context->value).base) ||
       ((L'\0' < (context->value).dice && (L'\0' < (context->value).sides)))) {
      local_20 = (context->value).base;
      iVar1 = damroll((context->value).dice,(context->value).sides);
      local_20 = local_20 + iVar1;
    }
    if (use_boost) {
      local_20 = ((context->boost + 100) * local_20) / 100;
    }
    context_local._4_4_ = local_20;
  }
  else {
    context_local._4_4_ = set_value;
  }
  return context_local._4_4_;
}

Assistant:

int effect_calculate_value(effect_handler_context_t *context, bool use_boost)
{
	int final = 0;

	if (set_value) {
		return set_value;
	}

	if (context->value.base > 0 ||
		(context->value.dice > 0 && context->value.sides > 0)) {
		final = context->value.base +
			damroll(context->value.dice, context->value.sides);
	}

	/* Device boost */
	if (use_boost) {
		final *= (100 + context->boost);
		final /= 100;
	}

	return final;
}